

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::ShaderExtensionTestCase::iterate(ShaderExtensionTestCase *this)

{
  ostringstream *this_00;
  TestContext *this_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  string shader;
  ShaderProgram program;
  ProgramSources sources;
  undefined1 local_198 [384];
  
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,
                     (this->mExtension)._M_dataplus._M_p);
  if (bVar1) {
    iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&shader,st2_compute_extensionCheck,(allocator<char> *)local_198);
    replaceToken("<EXTENSION>",(this->mExtension)._M_dataplus._M_p,&shader);
    memset(&sources,0,0xac);
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    sources._193_8_ = 0;
    glu::ComputeSource::ComputeSource((ComputeSource *)local_198,&shader);
    glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_198);
    std::__cxx11::string::~string((string *)(local_198 + 8));
    glu::ShaderProgram::ShaderProgram(&program,(Functions *)CONCAT44(extraout_var,iVar2),&sources);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (program.m_program.m_info.linkOk == false) {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_FAIL,"Fail");
      local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      this_00 = (ostringstream *)(local_198 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,"Checking shader preprocessor directives failed. Source:\n"
                     );
      std::operator<<((ostream *)this_00,shader._M_dataplus._M_p);
      std::operator<<((ostream *)this_00,"InfoLog:\n");
      std::operator<<((ostream *)this_00,
                      (string *)
                      &((*program.m_shaders[5].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start)->m_info).infoLog);
      std::operator<<((ostream *)this_00,"\n");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    else {
      tcu::TestContext::setTestResult(this_01,QP_TEST_RESULT_PASS,"Pass");
    }
    glu::ShaderProgram::~ShaderProgram(&program);
    glu::ProgramSources::~ProgramSources(&sources);
    std::__cxx11::string::~string((string *)&shader);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ShaderExtensionTestCase::iterate()
{
	if (!m_context.getContextInfo().isExtensionSupported(mExtension.c_str()))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
		return STOP;
	}

	const Functions& gl = m_context.getRenderContext().getFunctions();

	std::string shader = st2_compute_extensionCheck;
	replaceToken("<EXTENSION>", mExtension.c_str(), shader);

	ProgramSources sources;
	sources << ComputeSource(shader);
	ShaderProgram program(gl, sources);

	if (!program.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		m_testCtx.getLog() << tcu::TestLog::Message << "Checking shader preprocessor directives failed. Source:\n"
						   << shader.c_str() << "InfoLog:\n"
						   << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog << "\n"
						   << tcu::TestLog::EndMessage;
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}